

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesMipmapSparseResidency.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sparse::anon_unknown_4::MipmapSparseResidencyCase::createInstance
          (MipmapSparseResidencyCase *this,Context *context)

{
  MipmapSparseResidencyInstance *this_00;
  Context *context_local;
  MipmapSparseResidencyCase *this_local;
  
  this_00 = (MipmapSparseResidencyInstance *)operator_new(0x90);
  MipmapSparseResidencyInstance::MipmapSparseResidencyInstance
            (this_00,context,this->m_imageType,&this->m_imageSize,&this->m_format);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* MipmapSparseResidencyCase::createInstance (Context& context) const
{
	return new MipmapSparseResidencyInstance(context, m_imageType, m_imageSize, m_format);
}